

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86compiler.cpp
# Opt level: O1

Error __thiscall asmjit::X86Compiler::finalize(X86Compiler *this)

{
  CBConstPool *node;
  size_t sVar1;
  CodeHolder *code;
  Assembler *pAVar2;
  Error EVar3;
  ulong uVar4;
  bool bVar5;
  X86Assembler a;
  X86Assembler XStack_e8;
  
  EVar3 = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._lastError;
  if (EVar3 == 0) {
    node = (this->super_CodeCompiler)._globalConstPool;
    if (node != (CBConstPool *)0x0) {
      CodeBuilder::addNode((CodeBuilder *)this,(CBNode *)node);
      (this->super_CodeCompiler)._globalConstPool = (CBConstPool *)0x0;
    }
    sVar1 = (this->super_CodeCompiler).super_CodeBuilder._cbPasses.super_ZoneVectorBase._length;
    if (sVar1 == 0) {
      EVar3 = 0;
    }
    else {
      EVar3 = 0;
      uVar4 = 0;
      do {
        if ((this->super_CodeCompiler).super_CodeBuilder._cbPasses.super_ZoneVectorBase._length <=
            uVar4) {
          finalize();
          goto LAB_00120de7;
        }
        EVar3 = (**(code **)(**(long **)((long)(this->super_CodeCompiler).super_CodeBuilder.
                                               _cbPasses.super_ZoneVectorBase._data + uVar4 * 8) +
                            0x10))();
        Zone::reset(&(this->super_CodeCompiler).super_CodeBuilder._cbPassZone,false);
      } while ((EVar3 == 0) && (bVar5 = sVar1 - 1 != uVar4, uVar4 = uVar4 + 1, bVar5));
    }
    Zone::reset(&(this->super_CodeCompiler).super_CodeBuilder._cbPassZone,false);
    if (EVar3 != 0) {
LAB_00120de7:
      EVar3 = CodeEmitter::setLastError((CodeEmitter *)this,EVar3,(char *)0x0);
      return EVar3;
    }
    code = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._code;
    pAVar2 = code->_cgAsm;
    if (pAVar2 != (Assembler *)0x0) {
      EVar3 = (*(this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._vptr_CodeEmitter
                [0x10])(this,pAVar2);
      return EVar3;
    }
    X86Assembler::X86Assembler(&XStack_e8,code);
    EVar3 = (*(this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._vptr_CodeEmitter[0x10]
            )(this,&XStack_e8);
    X86Assembler::~X86Assembler(&XStack_e8);
  }
  return EVar3;
}

Assistant:

Error X86Compiler::finalize() {
  if (_lastError) return _lastError;

  // Flush the global constant pool.
  if (_globalConstPool) {
    addNode(_globalConstPool);
    _globalConstPool = nullptr;
  }

  Error err = kErrorOk;
  ZoneVector<CBPass*>& passes = _cbPasses;

  for (size_t i = 0, len = passes.getLength(); i < len; i++) {
    CBPass* pass = passes[i];
    err = pass->process(&_cbPassZone);
    _cbPassZone.reset();
    if (err) break;
  }

  _cbPassZone.reset();
  if (ASMJIT_UNLIKELY(err)) return setLastError(err);

  // TODO: There must be possibility to attach more assemblers, this is not so nice.
  if (_code->_cgAsm) {
    return serialize(_code->_cgAsm);
  }
  else {
    X86Assembler a(_code);
    return serialize(&a);
  }
}